

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

int __thiscall lattice::supercell::init(supercell *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  invalid_argument *this_00;
  size_t sVar5;
  ulong uVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  long *plVar9;
  supercell *psVar10;
  value_type_conflict1 *__x;
  reference pvVar11;
  size_type sVar12;
  logic_error *this_01;
  int __x_00;
  double extraout_XMM0_Qa;
  offset_t c;
  size_t i_1;
  size_t m_1;
  size_t lcord_max;
  size_t n;
  long v;
  size_t m;
  size_t i;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffeb8;
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffec0;
  size_type sVar13;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffec8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  DenseBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffef0;
  offset_t *in_stack_ffffffffffffff08;
  supercell *this_03;
  size_t in_stack_ffffffffffffff40;
  supercell *psVar14;
  supercell *this_04;
  ulong local_b0;
  ulong local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_30 [32];
  EVP_PKEY_CTX *local_10;
  supercell *local_8;
  
  local_10 = ctx;
  local_8 = this;
  Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<long,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffec0,
             (Matrix<long,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffeb8);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)0x1160c3);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)0x1160d6);
  if (IVar3 != IVar4) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid shape of span matrix");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_03 = (supercell *)&this->span_;
  sVar5 = Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)0x116154);
  this->dim_ = sVar5;
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::cast<double>(in_stack_fffffffffffffed8)
  ;
  __x_00 = (int)local_30;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>
  ::determinant(in_stack_fffffffffffffef0);
  std::abs(__x_00);
  uVar6 = (ulong)(extraout_XMM0_Qa + 0.5);
  this->num_cells_ =
       uVar6 | (long)((extraout_XMM0_Qa + 0.5) - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::cast<double>(in_stack_fffffffffffffed8)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>
  ::inverse(in_stack_fffffffffffffec8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffec0,
             (DenseBase<Eigen::Inverse<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>_>
              *)in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffec8);
  Eigen::Matrix<long,-1,1,0,-1,1>::operator=
            ((Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffec8);
  Eigen::Matrix<long,-1,1,0,-1,1>::operator=
            ((Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  for (local_88 = 0; local_88 < (ulong)(long)(1 << ((byte)this->dim_ & 0x1f));
      local_88 = local_88 + 1) {
    for (local_90 = 0; local_90 < this->dim_; local_90 = local_90 + 1) {
      local_98 = 0;
      for (local_a0 = 0; local_a0 < this->dim_; local_a0 = local_a0 + 1) {
        in_stack_ffffffffffffff08 = (offset_t *)(local_88 >> ((byte)local_a0 & 0x3f) & 1);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>,_1> *)
                            in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8,0x116309);
        local_98 = (long)in_stack_ffffffffffffff08 * *pSVar7 + local_98;
      }
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
      plVar9 = std::min<long>(pSVar8,&local_98);
      lVar1 = *plVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
      *pSVar8 = lVar1;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
      plVar9 = std::max<long>(pSVar8,&local_98);
      lVar1 = *plVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
      *pSVar8 = lVar1;
    }
  }
  for (local_b0 = 0; local_b0 < this->dim_; local_b0 = local_b0 + 1) {
    Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
              (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
    Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
              (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (size_type)in_stack_fffffffffffffed8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1164bb);
  psVar14 = (supercell *)0x0;
  while (this_04 = psVar14,
        psVar10 = (supercell *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&this->lcord2index_), psVar14 < psVar10) {
    lcord2offset(this_04,in_stack_ffffffffffffff40);
    bVar2 = within_supercell(this_03,in_stack_ffffffffffffff08);
    if (bVar2) {
      this_02 = &this->index2lcord_;
      __x = (value_type_conflict1 *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_02);
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->lcord2index_,(size_type)this_04);
      *pvVar11 = (value_type)__x;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_02,__x);
    }
    Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x1165b0);
    psVar14 = (supercell *)((long)&this_04->dim_ + 1);
  }
  sVar13 = this->num_cells_;
  sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->index2lcord_);
  if (sVar13 == sVar12) {
    return (int)sVar13;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"supercell::init() internal error");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void init(const span_t& span) {
    span_ = span;
    if (span_.cols() != span_.rows())
      throw std::invalid_argument("invalid shape of span matrix");
    dim_ = span_.cols();
    num_cells_ = std::size_t(std::abs(span_.cast<double>().determinant()) + 0.5);
    rs_ = span_.cast<double>().inverse();

    nmin_ = offset_t::Zero(dim_);
    nmax_ = offset_t::Zero(dim_);
    for (std::size_t i = 0; i < std::size_t(1 << dim_); ++i) {
      for (std::size_t m = 0; m < dim_; ++m) {
        long v = 0;
        for (std::size_t n = 0; n < dim_; ++n) v += ((i >> n) & 1) * span_(m, n);
        nmin_(m) = std::min(nmin_(m), v);
        nmax_(m) = std::max(nmax_(m), v);
      }
    }
    
    std::size_t lcord_max = 1;
    for (std::size_t m = 0; m < dim_; ++m) lcord_max *= (nmax_(m) - nmin_(m));
    lcord2index_.resize(lcord_max);
    index2lcord_.clear();
    for (std::size_t i = 0; i < lcord2index_.size(); ++i) {
      offset_t c = lcord2offset(i);
      if (within_supercell(c)) {
        lcord2index_[i] = index2lcord_.size();
        index2lcord_.push_back(i);
      }
    }
    if (num_cells_ != index2lcord_.size())
      throw std::logic_error("supercell::init() internal error");
  }